

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O0

void __thiscall
tyti::stl::
stl_parser_binary<float,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::stl_parser_binary(stl_parser_binary<float,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *this)

{
  expr_param pbVar1;
  actor<boost::spirit::argument<0>_> *paVar2;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::push_back>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<1>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>_&>,_2L>
  *a1;
  actor<boost::spirit::attribute<0>_> *tuple;
  actor<boost::spirit::attribute<0>_> *tuple_00;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<1>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
  *a0;
  actor<boost::spirit::attribute<0>_> *tuple_01;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
  *a0_00;
  actor<boost::spirit::attribute<0>_> *tuple_02;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<3>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
  *a0_01;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<1>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
  *a0_02;
  actor<boost::spirit::attribute<0>_> *tuple_03;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
  *a0_03;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<3>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
  *a0_04;
  phoenix *ppVar3;
  expr_param e;
  expr_param e_00;
  undefined4 local_d1e;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::little_word>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::push_back>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<3>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>_&>,_2L>
  local_d18;
  undefined1 local_cfe [6];
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_cf8;
  proto_child0 local_cf0;
  undefined4 local_ce4;
  terminal<boost::spirit::tag::repeat> local_ce0 [8];
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::push_back>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>_&>,_2L>_&>,_2L>
  local_cd8;
  undefined1 local_cbe [6];
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::push_back>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<1>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>_&>,_2L>
  local_cb8;
  expr<_c3ec69a3_> local_ca8;
  expr<_27cfb3a0_> local_c98;
  expr<_139ffa0d_> local_c88;
  type local_c7a;
  undefined4 local_c74;
  uint local_c70 [2];
  undefined1 local_c66 [20];
  type local_c52 [3];
  expr_type local_c44;
  undefined8 local_c3c;
  actor<_f9bcd16b_> that_13;
  terminal<boost::spirit::tag::byte_> local_c0b [3];
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  local_c08;
  undefined4 local_bf4;
  terminal<boost::spirit::tag::repeat> local_bf0 [8];
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
  local_be8;
  expr<_eccd61ae_> local_bd8;
  expr<_1f682955_> local_bc8;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::little_bin_float>_&,_const_boost::spirit::terminal<boost::spirit::tag::little_bin_float>_&>,_2L>
  local_bb8;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::little_bin_float>_&,_const_boost::spirit::terminal<boost::spirit::tag::little_bin_float>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::little_bin_float>_&>,_2L>
  local_ba8;
  allocator<char> local_b91;
  string local_b90;
  allocator<char> local_b69;
  string local_b68;
  allocator<char> local_b41;
  string local_b40;
  allocator<char> local_b09;
  string local_b08;
  stl_parser_binary<float,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_ae8;
  stl_parser_binary<float,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  undefined1 *local_ad8;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::little_bin_float>_&,_const_boost::spirit::terminal<boost::spirit::tag::little_bin_float>_&>,_2L>
  *local_ad0;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::little_bin_float>_&,_const_boost::spirit::terminal<boost::spirit::tag::little_bin_float>_&>,_2L>
  *local_ac8;
  proto_child1 local_ac0;
  undefined1 *local_ab0;
  undefined1 *local_aa8;
  proto_child0 local_aa0;
  proto_child1 local_a98;
  expr<_139ffa0d_> *local_a88;
  expr<_eccd61ae_> *local_a80;
  expr<_eccd61ae_> *local_a78;
  expr<_139ffa0d_> *local_a70;
  undefined1 *local_a60;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
  *local_a58;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
  *local_a50;
  undefined1 *local_a48;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  *local_a40;
  actor<boost::spirit::argument<0>_> *local_a38;
  actor<boost::spirit::argument<0>_> *local_a30;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
  that_5;
  undefined1 *puStack_a18;
  that_type that_4;
  undefined1 local_9c9;
  undefined1 *puStack_9c8;
  that_type that_14;
  actor<boost::spirit::attribute<0>_> local_8f1;
  proto_child1 local_8f0;
  proto_child0 local_8e8;
  proto_child0 local_8e0;
  proto_child1 local_8d8;
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *prStack_8c8;
  that_type that_16;
  undefined1 local_889;
  proto_child0 local_888;
  proto_child0 local_880;
  undefined1 *local_878;
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  **local_870;
  undefined4 *local_868;
  undefined4 *local_860;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::push_back>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>_&>,_2L>_&>,_2L>
  that_18;
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *prStack_848;
  that_type that_17;
  undefined1 local_809;
  proto_child0 local_808;
  proto_child0 local_800;
  undefined1 *local_7f8;
  undefined1 local_7e9;
  undefined1 *puStack_7e8;
  that_type that_20;
  expr_type that_1;
  expr_type that;
  expr_type that_23;
  expr_type that_15;
  undefined1 local_5e9;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  *local_5e8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  *local_5e0;
  undefined1 *local_5d8;
  undefined1 local_5c9;
  terminal<boost::spirit::tag::byte_> *local_5c8;
  undefined1 **local_5c0;
  undefined1 *local_5b8;
  terminal<boost::spirit::tag::byte_> *local_5b0;
  undefined1 *local_5a8;
  phoenix local_59b [3];
  undefined1 *puStack_598;
  expr_type that_2;
  undefined1 local_556;
  empty_env local_555;
  int local_554;
  empty_env d;
  phoenix *ppStack_550;
  empty_state s;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  local_53a;
  undefined1 local_539;
  data_param local_538;
  state_param local_530;
  phoenix *local_528;
  undefined1 *local_520;
  expr_param local_518;
  undefined1 *local_510;
  expr_type local_503;
  undefined1 local_501;
  expr_param pbStack_500;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  that_3;
  undefined1 local_4f1;
  proto_child0 local_4f0;
  undefined1 **local_4e8;
  undefined1 *local_4e0;
  proto_child0 local_4d8;
  undefined1 *local_4d0;
  undefined1 local_4c4 [8];
  expr_type that_12;
  undefined1 local_45e;
  empty_env local_45d;
  int local_45c;
  empty_env d_4;
  expr_param pbStack_458;
  empty_state s_4;
  impl<_d761afb8_> local_442;
  undefined1 local_441;
  data_param local_440;
  state_param local_438;
  expr_param local_430;
  undefined1 *local_428;
  expr_param local_420;
  undefined1 *local_418;
  expr_param local_410;
  undefined1 local_400 [8];
  expr_type that_10;
  undefined1 local_38e;
  empty_env local_38d;
  int local_38c;
  empty_env d_3;
  expr_param pbStack_388;
  empty_state s_3;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<1>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::multiplies,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_3L>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  local_362;
  undefined1 local_361;
  data_param local_360;
  state_param local_358;
  expr_param local_350;
  undefined1 *local_348;
  expr_type local_338;
  expr_type local_330;
  undefined1 *local_328;
  actor<boost::spirit::argument<0>_> *local_320;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<1>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::multiplies,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_3L>_>_>,_2L>_>
  that_11;
  undefined1 local_301;
  basic_expr<boost::proto::tagns_::tag::multiplies,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>
  local_300;
  expr_type that_6;
  basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>
  local_2c0 [2];
  undefined4 *local_2b8;
  undefined1 *local_2b0;
  proto_child0 local_2a4;
  empty_env local_29d;
  int local_29c;
  empty_env d_2;
  expr_param pbStack_298;
  empty_state s_2;
  undefined1 local_27e;
  empty_env local_27d;
  int local_27c;
  empty_env d_1;
  expr_param pbStack_278;
  empty_state s_1;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_&,_int,_boost::proto::envns_::empty_env>
  local_252;
  undefined1 local_251;
  data_param local_250;
  state_param local_248;
  expr_param local_240;
  undefined1 *local_238;
  proto_child0 local_22c;
  expr_param local_228;
  undefined1 *local_220;
  proto_child0 local_214;
  expr_param pbStack_210;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>
  that_8;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::multiplies,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  local_1ea [2];
  basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L> that_7;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::multiplies,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  that_9;
  expr_type that_22;
  expr_type that_21;
  expr_type that_19;
  undefined1 local_61;
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  **local_60;
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  **local_58;
  undefined1 *local_50;
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  **local_48;
  undefined1 *local_40;
  undefined1 local_31;
  proto_child0 local_30;
  undefined1 **local_28;
  undefined1 *local_20;
  proto_child0 local_18;
  undefined1 *local_10;
  
  local_ae8 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b08,"unnamed-grammar",&local_b09);
  boost::spirit::qi::
  grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::grammar(&this->
             super_grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
            ,&this->start,&local_b08);
  std::__cxx11::string::~string((string *)&local_b08);
  std::allocator<char>::~allocator(&local_b09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b40,"unnamed-rule",&local_b41)
  ;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->start,&local_b40);
  std::__cxx11::string::~string((string *)&local_b40);
  std::allocator<char>::~allocator(&local_b41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b68,"unnamed-rule",&local_b69)
  ;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->vector,&local_b68);
  std::__cxx11::string::~string((string *)&local_b68);
  std::allocator<char>::~allocator(&local_b69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b90,"unnamed-rule",&local_b91)
  ;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->endSolid,&local_b90);
  std::__cxx11::string::~string((string *)&local_b90);
  std::allocator<char>::~allocator(&local_b91);
  local_aa8 = &boost::spirit::little_bin_float;
  local_ab0 = &boost::spirit::little_bin_float;
  local_bb8.child0 = (proto_child0)&boost::spirit::little_bin_float;
  local_bb8.child1 = (proto_child1)&boost::spirit::little_bin_float;
  local_ba8.child0 = &local_bb8;
  local_ad8 = &boost::spirit::little_bin_float;
  local_ba8.child1 = (proto_child1)&boost::spirit::little_bin_float;
  local_ad0 = local_ba8.child0;
  local_ac8 = local_ba8.child0;
  local_ac0 = local_ba8.child1;
  local_aa0 = local_bb8.child0;
  local_a98 = local_bb8.child1;
  boost::spirit::qi::operator%=(&this->vector,&local_ba8);
  local_bf4 = 0x50;
  ppVar3 = (phoenix *)&boost::spirit::repeat;
  boost::spirit::terminal<boost::spirit::tag::repeat>::operator()
            (local_bf0,(int *)&boost::spirit::repeat,(is_false)&local_bf4);
  boost::phoenix::at_c<0,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,ppVar3,tuple);
  puStack_598 = &boost::spirit::_1;
  ppVar3 = local_59b;
  local_554 = 0;
  local_520 = &local_556;
  local_530 = &local_554;
  local_538 = &local_555;
  ppStack_550 = ppVar3;
  local_528 = ppVar3;
  local_518 = boost::proto::_::
              impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
              ::operator()(&local_53a,(expr_param)ppVar3,local_530,local_538);
  local_510 = &local_539;
  local_503 = (local_518->child0).proto_expr_;
  local_501 = local_518->field_0x2;
  local_c08.child1 = (proto_child1)local_c0b;
  puStack_a18 = &boost::spirit::byte_;
  local_5a8 = &local_5c9;
  local_5b8 = (undefined1 *)((long)&that_5.child1 + 7);
  local_5c0 = &puStack_a18;
  local_c08.child0 = (proto_child0)&boost::spirit::byte_;
  paVar2 = (actor<boost::spirit::argument<0>_> *)local_bf0;
  local_be8.child1 = &local_c08;
  local_5d8 = &local_5e9;
  local_be8.child0 = (proto_child0)paVar2;
  local_a40 = local_be8.child1;
  local_a38 = paVar2;
  local_a30 = paVar2;
  that_4.child1 = local_c08.child1;
  local_5e8 = local_be8.child1;
  local_5e0 = local_be8.child1;
  local_5c8 = (terminal<boost::spirit::tag::byte_> *)local_c08.child1;
  local_5b0 = (terminal<boost::spirit::tag::byte_> *)local_c08.child1;
  pbStack_500 = local_518;
  that_4.child0 = (proto_child0)local_c08.child1;
  boost::phoenix::at_c<1,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,ppVar3,tuple_00);
  ppVar3 = (phoenix *)&boost::spirit::_1;
  boost::phoenix::adl_barrier::
  reserve<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<mpl_::int_<1>>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>,boost::phoenix::actor<boost::spirit::argument<0>>>
            (local_c52,(adl_barrier *)&boost::spirit::_1,a0,paVar2);
  boost::phoenix::at_c<2,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,ppVar3,tuple_01);
  local_c74 = 3;
  local_2b8 = &local_c74;
  that_6 = (expr_type)&boost::spirit::_1;
  local_2b0 = &local_301;
  local_2c0[0].child0 = 3;
  pbStack_278 = local_2c0;
  local_27c = 0;
  local_238 = &local_27e;
  local_248 = &local_27c;
  local_250 = &local_27d;
  local_240 = pbStack_278;
  local_228 = boost::proto::_::
              impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_&,_int,_boost::proto::envns_::empty_env>
              ::operator()(&local_252,pbStack_278,local_248,local_250);
  local_220 = &local_251;
  local_300.child0.proto_expr_.child0 = (expr_type)local_228->child0;
  pbStack_298 = &local_300;
  local_29c = 0;
  _that_7 = &local_29d;
  local_2a4 = (proto_child0)local_300.child0.proto_expr_.child0;
  local_22c = (proto_child0)local_300.child0.proto_expr_.child0;
  local_214 = (proto_child0)local_300.child0.proto_expr_.child0;
  pbStack_210 = local_228;
  pbVar1 = boost::proto::_::
           impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::multiplies,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
           ::operator()(local_1ea,pbStack_298,&local_29c,_that_7);
  local_c70[0] = (pbVar1->child0).proto_expr_.child0;
  local_c66._2_8_ =
       boost::phoenix::adl_barrier::
       reserve<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<mpl_::int_<2>>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::multiplies,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>>
                 ((type *)local_c66,(adl_barrier *)local_c70,a0_00,
                  (actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::multiplies,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
                   *)(ulong)local_c70[0]);
  that_10.child1.proto_expr_.child2.proto_expr_ = (expr_type)((long)local_c66 + 2);
  e = (expr_param)local_400;
  local_38c = 0;
  local_348 = &local_38e;
  local_358 = &local_38c;
  local_360 = &local_38d;
  unique0x10000e16 = (type *)local_c66._2_8_;
  pbStack_388 = e;
  local_350 = e;
  local_330 = (expr_type)
              boost::proto::_::
              impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<1>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::multiplies,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_3L>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
              ::operator()(&local_362,e,local_358,local_360);
  local_328 = &local_361;
  paVar2 = *(actor<boost::spirit::argument<0>_> **)local_330;
  that_11.proto_expr_._0_8_ = ((proto_child2 *)((long)local_330 + 8))->proto_expr_;
  local_338 = that_11.proto_expr_.child0.proto_expr_;
  local_c44 = that_11.proto_expr_.child0.proto_expr_;
  local_320 = paVar2;
  that_11.proto_expr_.child1.proto_expr_.child2.proto_expr_ = local_330;
  boost::phoenix::at_c<3,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,(phoenix *)e,tuple_02);
  boost::phoenix::adl_barrier::
  reserve<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<mpl_::int_<3>>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>,boost::phoenix::actor<boost::spirit::argument<0>>>
            (&local_c7a,(adl_barrier *)&boost::spirit::_1,a0_01,paVar2);
  that_12._12_8_ = &local_c7a.proto_expr_.child1.proto_expr_.field_0x1;
  that_12.child0.proto_expr_.child0.proto_expr_ = local_c44;
  e_00 = (expr_param)local_4c4;
  local_45c = 0;
  local_428 = &local_45e;
  local_438 = &local_45c;
  local_440 = &local_45d;
  pbStack_458 = e_00;
  local_430 = e_00;
  local_420 = boost::proto::_::impl<$d761afb8$>::operator()(&local_442,e_00,local_438,local_440);
  local_418 = &local_441;
  local_c3c._0_4_ = (local_420->child0).proto_expr_.child0;
  local_c3c._4_1_ = (local_420->child0).proto_expr_.child1.proto_expr_.field_0x0;
  local_c3c._5_2_ = (local_420->child0).proto_expr_.child1.proto_expr_.child1;
  local_c3c._7_1_ = (local_420->child0).proto_expr_.child1.proto_expr_.field_0x3;
  that_13.proto_expr_.child0.proto_expr_._0_8_ =
       (local_420->child0).proto_expr_.child1.proto_expr_.child2.proto_expr_;
  that_13.proto_expr_.child0.proto_expr_.child1.proto_expr_.child2.proto_expr_.child0.proto_expr_.
  child0 = *(expr_type *)&(local_420->child1).proto_expr_;
  that_14.child1 = (proto_child1)&local_c3c;
  puStack_9c8 = &boost::spirit::little_dword;
  local_4d0 = &local_4f1;
  local_4e0 = &local_9c9;
  local_4e8 = &puStack_9c8;
  that_13.proto_expr_._12_8_ = &boost::spirit::little_dword;
  local_bd8.child0 = &local_be8;
  paVar2 = (actor<boost::spirit::argument<0>_> *)
           &that_13.proto_expr_.child0.proto_expr_.child1.proto_expr_.child2.proto_expr_.field_0x4;
  local_bd8.child1 = (proto_child1)paVar2;
  local_a60 = paVar2;
  local_a58 = local_bd8.child0;
  local_a50 = local_bd8.child0;
  local_a48 = paVar2;
  local_4f0 = (proto_child0)that_14.child1;
  local_4d8 = (proto_child0)that_14.child1;
  local_410 = local_420;
  that_14.child0 = (proto_child0)that_14.child1;
  boost::phoenix::at_c<1,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,(phoenix *)e_00,
             (actor<boost::spirit::attribute<0>_> *)local_bd8.child0);
  boost::phoenix::adl_barrier::
  push_back<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<mpl_::int_<1>>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>,boost::phoenix::actor<boost::spirit::argument<0>>>
            ((type *)local_cbe,(adl_barrier *)&boost::spirit::_1,a0_02,paVar2);
  local_cb8.child1 = (proto_child1)(local_cbe + 2);
  local_878 = &local_889;
  local_ce4 = 3;
  ppVar3 = (phoenix *)&boost::spirit::repeat;
  paVar2 = (actor<boost::spirit::argument<0>_> *)0x0;
  local_cb8.child0 = &this->vector;
  prStack_8c8 = &this->vector;
  that_16.child0 = (proto_child0)local_cb8.child1;
  that_16.child1 = local_cb8.child1;
  local_888 = (proto_child0)local_cb8.child1;
  local_880 = (proto_child0)local_cb8.child1;
  boost::spirit::terminal<boost::spirit::tag::repeat>::operator()
            (local_ce0,(int *)&boost::spirit::repeat,(is_false)&local_ce4);
  boost::phoenix::at_c<2,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,ppVar3,tuple_03);
  ppVar3 = (phoenix *)&boost::spirit::_1;
  boost::phoenix::adl_barrier::
  push_back<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<mpl_::int_<2>>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>,boost::phoenix::actor<boost::spirit::argument<0>>>
            ((type *)local_cfe,(adl_barrier *)&boost::spirit::_1,a0_03,paVar2);
  local_cf0 = (proto_child0)(local_cfe + 2);
  local_7f8 = &local_809;
  local_40 = (undefined1 *)((long)&that_18.child1 + 7);
  local_48 = &prStack_848;
  local_cd8.child0 = (proto_child0)local_ce0;
  local_cd8.child1 = (proto_child1)&local_cf8;
  local_50 = &local_61;
  a1 = &local_cb8;
  local_ca8.child1 = &local_cd8;
  local_cf8 = &this->vector;
  local_ca8.child0 = a1;
  local_8f0 = local_ca8.child1;
  local_8e8 = a1;
  local_8e0 = a1;
  local_8d8 = local_ca8.child1;
  local_870 = (rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               **)local_cd8.child1;
  local_868 = (undefined4 *)local_cd8.child0;
  local_860 = (undefined4 *)local_cd8.child0;
  prStack_848 = &this->vector;
  that_17.child0 = local_cf0;
  that_17.child1 = (proto_child1)local_cf0;
  local_808 = local_cf0;
  local_800 = local_cf0;
  local_60 = (rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              **)local_cd8.child1;
  local_58 = (rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              **)local_cd8.child1;
  boost::phoenix::at_c<3,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,ppVar3,&local_8f1);
  boost::phoenix::adl_barrier::
  push_back<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<mpl_::int_<3>>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>,boost::phoenix::actor<boost::spirit::argument<0>>>
            ((type *)&local_d1e,(adl_barrier *)&boost::spirit::_1,a0_04,
             (actor<boost::spirit::argument<0>_> *)a1);
  local_d18.child1 = (proto_child1)((long)&local_d1e + 2);
  puStack_7e8 = &boost::spirit::little_word;
  local_10 = &local_31;
  local_20 = &local_7e9;
  local_28 = &puStack_7e8;
  local_d18.child0 = (proto_child0)&boost::spirit::little_word;
  local_c98.child0 = &local_ca8;
  local_c98.child1 = &local_d18;
  local_c88.child0 = &local_c98;
  local_bc8.child0 = &local_bd8;
  local_bc8.child1 = &local_c88;
  local_a88 = local_bc8.child1;
  local_a80 = local_bc8.child0;
  local_a78 = local_bc8.child0;
  local_a70 = local_bc8.child1;
  that_20.child1 = local_d18.child1;
  local_30 = (proto_child0)local_d18.child1;
  local_18 = (proto_child0)local_d18.child1;
  that_20.child0 = (proto_child0)local_d18.child1;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::operator=<_34c844be_>(&this->start,&local_bc8);
  return;
}

Assistant:

stl_parser_binary() : stl_parser_binary::base_type(start)
            {
                namespace spirit = boost::spirit;
                namespace qi = boost::spirit::qi;
                namespace ql = qi::labels;
                namespace ascii = boost::spirit::ascii;
                namespace px = boost::phoenix;

                vector %= spirit::little_bin_float >> spirit::little_bin_float >> spirit::little_bin_float;

                start =
                    qi::repeat(80)[spirit::byte_[px::at_c<0>(ql::_val) += ql::_1]]              //80x8-bit header
                    >> spirit::little_dword[px::reserve(px::at_c<1>(ql::_val), ql::_1),
                    px::reserve(px::at_c<2>(ql::_val), 3 * ql::_1),
                    px::reserve(px::at_c<3>(ql::_val), ql::_1)]    //# of triangles
                    >> *(vector[px::push_back(px::at_c<1>(ql::_val), ql::_1)]  //normal
                        >> spirit::repeat(3)[vector[px::push_back(px::at_c<2>(ql::_val), ql::_1)]] //vertices
                        >> spirit::little_word[px::push_back(px::at_c<3>(ql::_val), ql::_1)]  //attribute
                        )
                    //end
                    ;
            }